

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackendOpCodeAttr.cpp
# Opt level: O3

int OpCodeAttr::GetOpCodeDebugAttributes(OpCode op)

{
  code *pcVar1;
  bool bVar2;
  undefined1 *puVar3;
  undefined4 *puVar4;
  int *piVar5;
  undefined6 in_register_0000003a;
  uint uVar6;
  
  if ((uint)CONCAT62(in_register_0000003a,op) < 0x100) {
    piVar5 = (int *)(OpcodeDebugAttributes + (ulong)op * 4);
  }
  else {
    if (op < 0x189) {
      uVar6 = op - 0x100;
      puVar3 = ExtendedOpcodeDebugAttributes;
    }
    else {
      uVar6 = op - 0x18a;
      if (0x328 < uVar6) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/BackendOpCodeAttr.cpp"
                           ,0x10e,
                           "(opIndex < (sizeof(*__countof_helper(BackendOpCodeDebugAttributes)) + 0))"
                           ,
                           "opIndex < (sizeof(*__countof_helper(BackendOpCodeDebugAttributes)) + 0)"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      puVar3 = BackendOpCodeDebugAttributes;
    }
    piVar5 = (int *)(puVar3 + (ulong)uVar6 * 4);
  }
  return *piVar5;
}

Assistant:

static const int GetOpCodeDebugAttributes(Js::OpCode op)
{
    if (op <= Js::OpCode::MaxByteSizedOpcodes)
    {
        AnalysisAssert(op < _countof(OpcodeDebugAttributes));
        return OpcodeDebugAttributes[(int)op];
    }
    else if (op < Js::OpCode::ByteCodeLast)
    {
        uint opIndex = op - (Js::OpCode::MaxByteSizedOpcodes + 1);
        AnalysisAssert(opIndex < _countof(ExtendedOpcodeDebugAttributes));
        return ExtendedOpcodeDebugAttributes[opIndex];
    }
    uint opIndex = op - (Js::OpCode::ByteCodeLast + 1);
    AnalysisAssert(opIndex < _countof(BackendOpCodeDebugAttributes));
    return BackendOpCodeDebugAttributes[opIndex];
}